

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<QObject_const*,QStyleAnimation*>::emplace<QStyleAnimation*const&>
          (QHash<QObject_const*,QStyleAnimation*> *this,QObject **key,QStyleAnimation **args)

{
  ulong uVar1;
  Data<QHashPrivate::Node<const_QObject_*,_QStyleAnimation_*>_> *pDVar2;
  QStyleAnimation *pQVar3;
  long in_FS_OFFSET;
  piter pVar4;
  QHash<const_QObject_*,_QStyleAnimation_*> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = *(QStyleAnimation **)this;
  if (pQVar3 == (QStyleAnimation *)0x0) {
    local_28.d = (Data *)0x0;
LAB_0033ce05:
    pQVar3 = (QStyleAnimation *)0x0;
LAB_0033ce26:
    pDVar2 = QHashPrivate::Data<QHashPrivate::Node<const_QObject_*,_QStyleAnimation_*>_>::detached
                       ((Data<QHashPrivate::Node<const_QObject_*,_QStyleAnimation_*>_> *)pQVar3);
    *(Data<QHashPrivate::Node<const_QObject_*,_QStyleAnimation_*>_> **)this = pDVar2;
  }
  else {
    if (*(uint *)pQVar3 < 2) {
      uVar1._0_4_ = pQVar3->_delay;
      uVar1._4_4_ = pQVar3->_duration;
      if (*(ulong *)&pQVar3->field_0x8 < uVar1 >> 1) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          pVar4 = (piter)emplace_helper<QStyleAnimation*const&>(this,key,args);
          return (iterator)pVar4;
        }
      }
      else {
        local_28.d = (Data *)*args;
        pVar4 = (piter)emplace_helper<QStyleAnimation*>(this,key,(QStyleAnimation **)&local_28);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          return (iterator)pVar4;
        }
      }
      goto LAB_0033ce8e;
    }
    local_28.d = (Data *)pQVar3;
    if (*(uint *)pQVar3 != 0xffffffff) {
      LOCK();
      *(uint *)pQVar3 = *(uint *)pQVar3 + 1;
      UNLOCK();
      pQVar3 = *(QStyleAnimation **)this;
      if (pQVar3 == (QStyleAnimation *)0x0) goto LAB_0033ce05;
    }
    if (1 < *(uint *)pQVar3) goto LAB_0033ce26;
  }
  pVar4 = (piter)emplace_helper<QStyleAnimation*const&>(this,key,args);
  QHash<const_QObject_*,_QStyleAnimation_*>::~QHash(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar4;
  }
LAB_0033ce8e:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }